

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O3

SurfaceInfo * Omega_h::get_surface_info(SurfaceInfo *__return_storage_ptr__,Mesh *mesh)

{
  int *piVar1;
  uint uVar2;
  Alloc *pAVar3;
  void *pvVar4;
  Alloc *pAVar5;
  Alloc *pAVar6;
  Alloc *pAVar7;
  Alloc *this;
  int iVar8;
  Alloc *pAVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  Reals curv_vert_tangents;
  Reals curv_edge_tangents;
  Reals surf_tri_IIs;
  LOs surf_vert2vert;
  LOs surf_side2side;
  Reals curv_edge_curvatures;
  Reals curv_vert_curvatures;
  Read<signed_char> verts_are_surf;
  Read<signed_char> sides_are_surf;
  Reals surf_vert_IIs;
  Alloc *local_2c8;
  void *local_2c0;
  Alloc *local_2b8;
  void *local_2b0;
  Alloc *local_2a8;
  void *pvStack_2a0;
  Alloc *local_298;
  void *pvStack_290;
  Alloc *local_288;
  void *pvStack_280;
  Alloc *local_278;
  void *local_270;
  Alloc *local_268;
  void *local_260;
  SurfaceInfo *local_258;
  Alloc *local_250;
  void *local_248;
  Alloc *local_240;
  void *local_238;
  Alloc *local_230;
  Mesh *local_228;
  Reals local_220;
  LOs local_210;
  LOs local_200;
  Reals local_1f0;
  LOs local_1e0;
  Reals local_1d0;
  LOs local_1c0;
  LOs local_1b0;
  Reals local_1a0;
  Reals local_190;
  LOs local_180;
  LOs local_170;
  Reals local_160;
  LOs local_150;
  Read<signed_char> local_140;
  Read<signed_char> local_130;
  Reals local_120;
  LOs local_110;
  Read<signed_char> local_100;
  Read<signed_char> local_f0;
  Alloc *local_e0;
  void *local_d8;
  Alloc *local_d0;
  void *local_c8;
  LOs local_c0;
  Reals local_b0;
  LOs local_a0;
  LOs local_90;
  Reals local_80;
  Alloc *local_70;
  void *local_68;
  Reals local_60;
  LOs local_50;
  LOs local_40;
  
  (__return_storage_ptr__->curv_vert_curvatures).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->curv_vert_curvatures).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (__return_storage_ptr__->curv_vert_tangents).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->curv_vert_tangents).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (__return_storage_ptr__->curv_vert2vert).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->curv_vert2vert).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (__return_storage_ptr__->surf_vert_IIs).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->surf_vert_IIs).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (__return_storage_ptr__->surf_vert_normals).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->surf_vert_normals).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (__return_storage_ptr__->surf_vert2vert).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (__return_storage_ptr__->surf_vert2vert).write_.shared_alloc_.direct_ptr = (void *)0x0;
  uVar2 = mesh->dim_;
  local_258 = __return_storage_ptr__;
  if (3 < uVar2) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  if (uVar2 != 1) {
    iVar8 = uVar2 - 1;
    mark_by_class_dim((Omega_h *)&local_d0,mesh,iVar8,iVar8);
    mark_by_class_dim((Omega_h *)&local_e0,mesh,0,iVar8);
    local_f0.write_.shared_alloc_.alloc = local_d0;
    if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_f0.write_.shared_alloc_.alloc = (Alloc *)(local_d0->size * 8 + 1);
      }
      else {
        local_d0->use_count = local_d0->use_count + 1;
      }
    }
    local_f0.write_.shared_alloc_.direct_ptr = local_c8;
    collect_marked((Omega_h *)&local_268,&local_f0);
    pAVar9 = local_f0.write_.shared_alloc_.alloc;
    if (((ulong)local_f0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_f0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_f0.write_.shared_alloc_.alloc);
        operator_delete(pAVar9,0x48);
      }
    }
    local_100.write_.shared_alloc_.alloc = local_e0;
    if (((ulong)local_e0 & 7) == 0 && local_e0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_100.write_.shared_alloc_.alloc = (Alloc *)(local_e0->size * 8 + 1);
      }
      else {
        local_e0->use_count = local_e0->use_count + 1;
      }
    }
    local_100.write_.shared_alloc_.direct_ptr = local_d8;
    collect_marked((Omega_h *)&local_278,&local_100);
    pAVar9 = local_100.write_.shared_alloc_.alloc;
    if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
        local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_100.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_100.write_.shared_alloc_.alloc);
        operator_delete(pAVar9,0x48);
      }
    }
    local_298 = (Alloc *)0x0;
    pvStack_290 = (void *)0x0;
    local_2a8 = (Alloc *)0x0;
    pvStack_2a0 = (void *)0x0;
    if (3 < (uint)mesh->dim_) {
      fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
           ,0x33);
    }
    if (mesh->dim_ == 3) {
      local_40.write_.shared_alloc_.alloc = local_268;
      if (((ulong)local_268 & 7) == 0 && local_268 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_40.write_.shared_alloc_.alloc = (Alloc *)(local_268->size * 8 + 1);
        }
        else {
          local_268->use_count = local_268->use_count + 1;
        }
      }
      pAVar9 = local_40.write_.shared_alloc_.alloc;
      local_40.write_.shared_alloc_.direct_ptr = local_260;
      get_side_vectors((Omega_h *)&local_2b8,mesh,&local_40);
      if (((ulong)pAVar9 & 7) == 0 && pAVar9 != (Alloc *)0x0) {
        piVar1 = &pAVar9->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar9);
          operator_delete(pAVar9,0x48);
        }
      }
      local_110.write_.shared_alloc_.alloc = local_268;
      if (((ulong)local_268 & 7) == 0 && local_268 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_110.write_.shared_alloc_.alloc = (Alloc *)(local_268->size * 8 + 1);
        }
        else {
          local_268->use_count = local_268->use_count + 1;
        }
      }
      pAVar9 = local_110.write_.shared_alloc_.alloc;
      local_110.write_.shared_alloc_.direct_ptr = local_260;
      local_120.write_.shared_alloc_.alloc = local_2b8;
      if (((ulong)local_2b8 & 7) == 0 && local_2b8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_120.write_.shared_alloc_.alloc = (Alloc *)(local_2b8->size * 8 + 1);
        }
        else {
          local_2b8->use_count = local_2b8->use_count + 1;
        }
      }
      pAVar3 = local_120.write_.shared_alloc_.alloc;
      local_120.write_.shared_alloc_.direct_ptr = local_2b0;
      local_50.write_.shared_alloc_.alloc = local_278;
      if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_50.write_.shared_alloc_.alloc = (Alloc *)(local_278->size * 8 + 1);
        }
        else {
          local_278->use_count = local_278->use_count + 1;
        }
      }
      pAVar6 = local_50.write_.shared_alloc_.alloc;
      local_50.write_.shared_alloc_.direct_ptr = local_270;
      get_side_vert_normals((Omega_h *)&local_2c8,mesh,&local_110,&local_120,&local_50);
      if (((ulong)pAVar6 & 7) == 0 && pAVar6 != (Alloc *)0x0) {
        piVar1 = &pAVar6->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar6);
          operator_delete(pAVar6,0x48);
        }
      }
      if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
        piVar1 = &pAVar3->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar3);
          operator_delete(pAVar3,0x48);
        }
      }
      if (((ulong)pAVar9 & 7) == 0 && pAVar9 != (Alloc *)0x0) {
        piVar1 = &pAVar9->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar9);
          operator_delete(pAVar9,0x48);
        }
      }
      mark_by_class_dim((Omega_h *)&local_250,mesh,1,1);
      mark_by_class_dim((Omega_h *)&local_240,mesh,0,1);
      local_130.write_.shared_alloc_.alloc = local_250;
      if (((ulong)local_250 & 7) == 0 && local_250 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_130.write_.shared_alloc_.alloc = (Alloc *)(local_250->size * 8 + 1);
        }
        else {
          local_250->use_count = local_250->use_count + 1;
        }
      }
      local_130.write_.shared_alloc_.direct_ptr = local_248;
      collect_marked((Omega_h *)&local_288,&local_130);
      pAVar3 = local_130.write_.shared_alloc_.alloc;
      pvVar4 = pvStack_280;
      local_298 = local_288;
      pvStack_290 = pvStack_280;
      if ((((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) &&
         (entering_parallel == '\x01')) {
        local_288->use_count = local_288->use_count + -1;
        local_298 = (Alloc *)(local_288->size * 8 + 1);
      }
      pAVar9 = local_298;
      local_288 = (Alloc *)0x0;
      pvStack_280 = (void *)0x0;
      if (((ulong)local_130.write_.shared_alloc_.alloc & 7) == 0 &&
          local_130.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_130.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_130.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      local_140.write_.shared_alloc_.alloc = local_240;
      if (((ulong)local_240 & 7) == 0 && local_240 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_140.write_.shared_alloc_.alloc = (Alloc *)(local_240->size * 8 + 1);
        }
        else {
          local_240->use_count = local_240->use_count + 1;
        }
      }
      local_140.write_.shared_alloc_.direct_ptr = local_238;
      collect_marked((Omega_h *)&local_288,&local_140);
      pAVar3 = local_140.write_.shared_alloc_.alloc;
      local_2a8 = local_288;
      pvStack_2a0 = pvStack_280;
      if ((((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) &&
         (entering_parallel == '\x01')) {
        local_288->use_count = local_288->use_count + -1;
        local_2a8 = (Alloc *)(local_288->size * 8 + 1);
      }
      local_288 = (Alloc *)0x0;
      pvStack_280 = (void *)0x0;
      if (((ulong)local_140.write_.shared_alloc_.alloc & 7) == 0 &&
          local_140.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_140.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_140.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      local_150.write_.shared_alloc_.alloc = local_268;
      if (((ulong)local_268 & 7) == 0 && local_268 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_150.write_.shared_alloc_.alloc = (Alloc *)(local_268->size * 8 + 1);
        }
        else {
          local_268->use_count = local_268->use_count + 1;
        }
      }
      pAVar3 = local_150.write_.shared_alloc_.alloc;
      local_150.write_.shared_alloc_.direct_ptr = local_260;
      local_160.write_.shared_alloc_.alloc = local_2b8;
      local_230 = (Alloc *)pvVar4;
      if (((ulong)local_2b8 & 7) == 0 && local_2b8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_160.write_.shared_alloc_.alloc = (Alloc *)(local_2b8->size * 8 + 1);
        }
        else {
          local_2b8->use_count = local_2b8->use_count + 1;
        }
      }
      pAVar6 = local_160.write_.shared_alloc_.alloc;
      local_160.write_.shared_alloc_.direct_ptr = local_2b0;
      local_170.write_.shared_alloc_.alloc = local_278;
      if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_170.write_.shared_alloc_.alloc = (Alloc *)(local_278->size * 8 + 1);
        }
        else {
          local_278->use_count = local_278->use_count + 1;
        }
      }
      pAVar5 = local_170.write_.shared_alloc_.alloc;
      local_170.write_.shared_alloc_.direct_ptr = local_270;
      local_60.write_.shared_alloc_.alloc = local_2c8;
      if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_60.write_.shared_alloc_.alloc = (Alloc *)(local_2c8->size * 8 + 1);
        }
        else {
          local_2c8->use_count = local_2c8->use_count + 1;
        }
      }
      pAVar7 = local_60.write_.shared_alloc_.alloc;
      local_60.write_.shared_alloc_.direct_ptr = local_2c0;
      get_surf_tri_IIs((Omega_h *)&local_288,mesh,&local_150,&local_160,&local_170,&local_60);
      if (((ulong)pAVar7 & 7) == 0 && pAVar7 != (Alloc *)0x0) {
        piVar1 = &pAVar7->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar7);
          operator_delete(pAVar7,0x48);
        }
      }
      if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
        piVar1 = &pAVar5->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar5);
          operator_delete(pAVar5,0x48);
        }
      }
      if (((ulong)pAVar6 & 7) == 0 && pAVar6 != (Alloc *)0x0) {
        piVar1 = &pAVar6->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar6);
          operator_delete(pAVar6,0x48);
        }
      }
      if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
        piVar1 = &pAVar3->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar3);
          operator_delete(pAVar3,0x48);
        }
      }
      local_180.write_.shared_alloc_.alloc = local_268;
      if (((ulong)local_268 & 7) == 0 && local_268 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_180.write_.shared_alloc_.alloc = (Alloc *)(local_268->size * 8 + 1);
        }
        else {
          local_268->use_count = local_268->use_count + 1;
        }
      }
      pAVar3 = local_180.write_.shared_alloc_.alloc;
      local_180.write_.shared_alloc_.direct_ptr = local_260;
      local_190.write_.shared_alloc_.alloc = local_2b8;
      if (((ulong)local_2b8 & 7) == 0 && local_2b8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_190.write_.shared_alloc_.alloc = (Alloc *)(local_2b8->size * 8 + 1);
        }
        else {
          local_2b8->use_count = local_2b8->use_count + 1;
        }
      }
      pAVar6 = local_190.write_.shared_alloc_.alloc;
      local_190.write_.shared_alloc_.direct_ptr = local_2b0;
      local_1a0.write_.shared_alloc_.alloc = local_288;
      if (((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_1a0.write_.shared_alloc_.alloc = (Alloc *)(local_288->size * 8 + 1);
        }
        else {
          local_288->use_count = local_288->use_count + 1;
        }
      }
      pAVar5 = local_1a0.write_.shared_alloc_.alloc;
      local_1a0.write_.shared_alloc_.direct_ptr = pvStack_280;
      local_1b0.write_.shared_alloc_.alloc = local_278;
      if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_1b0.write_.shared_alloc_.alloc = (Alloc *)(local_278->size * 8 + 1);
        }
        else {
          local_278->use_count = local_278->use_count + 1;
        }
      }
      pAVar7 = local_1b0.write_.shared_alloc_.alloc;
      local_1b0.write_.shared_alloc_.direct_ptr = local_270;
      local_80.write_.shared_alloc_.alloc = local_2c8;
      if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_80.write_.shared_alloc_.alloc = (Alloc *)(local_2c8->size * 8 + 1);
        }
        else {
          local_2c8->use_count = local_2c8->use_count + 1;
        }
      }
      this = local_80.write_.shared_alloc_.alloc;
      local_80.write_.shared_alloc_.direct_ptr = local_2c0;
      local_228 = mesh;
      get_surf_vert_IIs((Omega_h *)&local_70,mesh,&local_180,&local_190,&local_1a0,&local_1b0,
                        &local_80);
      if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
        piVar1 = &this->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(this);
          operator_delete(this,0x48);
        }
      }
      if (((ulong)pAVar7 & 7) == 0 && pAVar7 != (Alloc *)0x0) {
        piVar1 = &pAVar7->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar7);
          operator_delete(pAVar7,0x48);
        }
      }
      if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
        piVar1 = &pAVar5->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar5);
          operator_delete(pAVar5,0x48);
        }
      }
      pAVar5 = local_230;
      if (((ulong)pAVar6 & 7) == 0 && pAVar6 != (Alloc *)0x0) {
        piVar1 = &pAVar6->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar6);
          operator_delete(pAVar6,0x48);
        }
      }
      mesh = local_228;
      if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
        piVar1 = &pAVar3->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(pAVar3);
          operator_delete(pAVar3,0x48);
        }
      }
      (local_258->surf_vert2vert).write_.shared_alloc_.alloc = local_278;
      if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          (local_258->surf_vert2vert).write_.shared_alloc_.alloc =
               (Alloc *)(local_278->size * 8 + 1);
        }
        else {
          local_278->use_count = local_278->use_count + 1;
        }
      }
      (local_258->surf_vert2vert).write_.shared_alloc_.direct_ptr = local_270;
      (local_258->surf_vert_normals).write_.shared_alloc_.alloc = local_2c8;
      if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          (local_258->surf_vert_normals).write_.shared_alloc_.alloc =
               (Alloc *)(local_2c8->size * 8 + 1);
        }
        else {
          local_2c8->use_count = local_2c8->use_count + 1;
        }
      }
      (local_258->surf_vert_normals).write_.shared_alloc_.direct_ptr = local_2c0;
      (local_258->surf_vert_IIs).write_.shared_alloc_.alloc = local_70;
      if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          (local_258->surf_vert_IIs).write_.shared_alloc_.alloc = (Alloc *)(local_70->size * 8 + 1);
          iVar8 = local_70->use_count + -1;
        }
        else {
          iVar8 = local_70->use_count;
          local_70->use_count = iVar8 + 1;
        }
        (local_258->surf_vert_IIs).write_.shared_alloc_.direct_ptr = local_68;
        local_70->use_count = iVar8;
        if (iVar8 == 0) {
          Alloc::~Alloc(local_70);
          operator_delete(local_70,0x48);
        }
      }
      else {
        (local_258->surf_vert_IIs).write_.shared_alloc_.direct_ptr = local_68;
      }
      pAVar3 = local_288;
      if (((ulong)local_288 & 7) == 0 && local_288 != (Alloc *)0x0) {
        piVar1 = &local_288->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_288);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_240;
      if (((ulong)local_240 & 7) == 0 && local_240 != (Alloc *)0x0) {
        piVar1 = &local_240->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_240);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_250;
      if (((ulong)local_250 & 7) == 0 && local_250 != (Alloc *)0x0) {
        piVar1 = &local_250->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_250);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_2c8;
      if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
        piVar1 = &local_2c8->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_2c8);
          operator_delete(pAVar3,0x48);
        }
      }
      pAVar3 = local_2b8;
      local_260 = pAVar5;
      if (((ulong)local_2b8 & 7) == 0 && local_2b8 != (Alloc *)0x0) {
        piVar1 = &local_2b8->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_2b8);
          operator_delete(pAVar3,0x48);
        }
      }
    }
    else {
      local_298 = local_268;
      if (((ulong)local_268 & 7) == 0 && local_268 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_298 = (Alloc *)(local_268->size * 8 + 1);
        }
        else {
          local_268->use_count = local_268->use_count + 1;
        }
      }
      pvStack_290 = local_260;
      local_2a8 = local_278;
      if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_2a8 = (Alloc *)(local_278->size * 8 + 1);
        }
        else {
          local_278->use_count = local_278->use_count + 1;
        }
      }
      pvStack_2a0 = local_270;
      pAVar9 = local_298;
    }
    local_90.write_.shared_alloc_.alloc = pAVar9;
    if (((ulong)pAVar9 & 7) == 0 && pAVar9 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_90.write_.shared_alloc_.alloc = (Alloc *)(pAVar9->size * 8 + 1);
      }
      else {
        pAVar9->use_count = pAVar9->use_count + 1;
      }
    }
    pAVar3 = local_90.write_.shared_alloc_.alloc;
    local_90.write_.shared_alloc_.direct_ptr = local_260;
    get_curv_edge_tangents((Omega_h *)&local_2b8,mesh,&local_90);
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
        pAVar9 = local_298;
      }
    }
    local_1c0.write_.shared_alloc_.alloc = pAVar9;
    if ((pAVar9 != (Alloc *)0x0) && (((ulong)pAVar9 & 7) == 0)) {
      if (entering_parallel == '\x01') {
        local_1c0.write_.shared_alloc_.alloc = (Alloc *)(pAVar9->size * 8 + 1);
      }
      else {
        pAVar9->use_count = pAVar9->use_count + 1;
      }
    }
    pAVar3 = local_1c0.write_.shared_alloc_.alloc;
    local_1c0.write_.shared_alloc_.direct_ptr = pvStack_290;
    local_1d0.write_.shared_alloc_.alloc = local_2b8;
    if (((ulong)local_2b8 & 7) == 0 && local_2b8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1d0.write_.shared_alloc_.alloc = (Alloc *)(local_2b8->size * 8 + 1);
      }
      else {
        local_2b8->use_count = local_2b8->use_count + 1;
      }
    }
    pAVar6 = local_1d0.write_.shared_alloc_.alloc;
    local_1d0.write_.shared_alloc_.direct_ptr = local_2b0;
    local_a0.write_.shared_alloc_.alloc = local_2a8;
    if (((ulong)local_2a8 & 7) == 0 && local_2a8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_a0.write_.shared_alloc_.alloc = (Alloc *)(local_2a8->size * 8 + 1);
      }
      else {
        local_2a8->use_count = local_2a8->use_count + 1;
      }
    }
    pAVar5 = local_a0.write_.shared_alloc_.alloc;
    local_a0.write_.shared_alloc_.direct_ptr = pvStack_2a0;
    get_curv_vert_tangents((Omega_h *)&local_2c8,mesh,&local_1c0,&local_1d0,&local_a0);
    if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
      piVar1 = &pAVar5->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar5);
        operator_delete(pAVar5,0x48);
      }
    }
    if (((ulong)pAVar6 & 7) == 0 && pAVar6 != (Alloc *)0x0) {
      piVar1 = &pAVar6->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar6);
        operator_delete(pAVar6,0x48);
      }
    }
    local_1e0.write_.shared_alloc_.alloc = pAVar9;
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
        local_1e0.write_.shared_alloc_.alloc = local_298;
      }
    }
    if ((local_1e0.write_.shared_alloc_.alloc != (Alloc *)0x0) &&
       (((ulong)local_1e0.write_.shared_alloc_.alloc & 7) == 0)) {
      if (entering_parallel == '\x01') {
        local_1e0.write_.shared_alloc_.alloc =
             (Alloc *)((local_1e0.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_1e0.write_.shared_alloc_.alloc)->use_count =
             (local_1e0.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pAVar9 = local_1e0.write_.shared_alloc_.alloc;
    local_1e0.write_.shared_alloc_.direct_ptr = pvStack_290;
    local_1f0.write_.shared_alloc_.alloc = local_2b8;
    if (((ulong)local_2b8 & 7) == 0 && local_2b8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1f0.write_.shared_alloc_.alloc = (Alloc *)(local_2b8->size * 8 + 1);
      }
      else {
        local_2b8->use_count = local_2b8->use_count + 1;
      }
    }
    pAVar3 = local_1f0.write_.shared_alloc_.alloc;
    local_1f0.write_.shared_alloc_.direct_ptr = local_2b0;
    local_200.write_.shared_alloc_.alloc = local_2a8;
    if (((ulong)local_2a8 & 7) == 0 && local_2a8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_200.write_.shared_alloc_.alloc = (Alloc *)(local_2a8->size * 8 + 1);
      }
      else {
        local_2a8->use_count = local_2a8->use_count + 1;
      }
    }
    pAVar6 = local_200.write_.shared_alloc_.alloc;
    local_200.write_.shared_alloc_.direct_ptr = pvStack_2a0;
    local_b0.write_.shared_alloc_.alloc = local_2c8;
    if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b0.write_.shared_alloc_.alloc = (Alloc *)(local_2c8->size * 8 + 1);
      }
      else {
        local_2c8->use_count = local_2c8->use_count + 1;
      }
    }
    pAVar5 = local_b0.write_.shared_alloc_.alloc;
    local_b0.write_.shared_alloc_.direct_ptr = local_2c0;
    get_curv_edge_curvatures((Omega_h *)&local_250,mesh,&local_1e0,&local_1f0,&local_200,&local_b0);
    if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
      piVar1 = &pAVar5->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar5);
        operator_delete(pAVar5,0x48);
      }
    }
    if (((ulong)pAVar6 & 7) == 0 && pAVar6 != (Alloc *)0x0) {
      piVar1 = &pAVar6->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar6);
        operator_delete(pAVar6,0x48);
      }
    }
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    if (((ulong)pAVar9 & 7) == 0 && pAVar9 != (Alloc *)0x0) {
      piVar1 = &pAVar9->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar9);
        operator_delete(pAVar9,0x48);
      }
    }
    pvVar4 = pvStack_2a0;
    pAVar9 = local_2a8;
    local_210.write_.shared_alloc_.alloc = local_298;
    bVar10 = local_298 != (Alloc *)0x0;
    bVar11 = ((ulong)local_298 & 7) == 0;
    if (bVar11 && bVar10) {
      if (entering_parallel == '\x01') {
        local_210.write_.shared_alloc_.alloc = (Alloc *)(local_298->size * 8 + 1);
      }
      else {
        local_298->use_count = local_298->use_count + 1;
      }
    }
    pAVar3 = local_210.write_.shared_alloc_.alloc;
    local_210.write_.shared_alloc_.direct_ptr = pvStack_290;
    local_220.write_.shared_alloc_.alloc = local_250;
    local_230 = local_298;
    if (((ulong)local_250 & 7) == 0 && local_250 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_220.write_.shared_alloc_.alloc = (Alloc *)(local_250->size * 8 + 1);
      }
      else {
        local_250->use_count = local_250->use_count + 1;
      }
    }
    pAVar6 = local_220.write_.shared_alloc_.alloc;
    local_220.write_.shared_alloc_.direct_ptr = local_248;
    local_c0.write_.shared_alloc_.alloc = local_2a8;
    bVar12 = local_2a8 != (Alloc *)0x0;
    bVar13 = ((ulong)local_2a8 & 7) == 0;
    if (bVar13 && bVar12) {
      if (entering_parallel == '\x01') {
        local_c0.write_.shared_alloc_.alloc = (Alloc *)(local_2a8->size * 8 + 1);
      }
      else {
        local_2a8->use_count = local_2a8->use_count + 1;
      }
    }
    pAVar5 = local_c0.write_.shared_alloc_.alloc;
    local_c0.write_.shared_alloc_.direct_ptr = pvStack_2a0;
    get_curv_vert_curvatures((Omega_h *)&local_240,mesh,&local_210,&local_220,&local_c0);
    if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
      piVar1 = &pAVar5->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar5);
        operator_delete(pAVar5,0x48);
      }
    }
    if (((ulong)pAVar6 & 7) == 0 && pAVar6 != (Alloc *)0x0) {
      piVar1 = &pAVar6->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar6);
        operator_delete(pAVar6,0x48);
      }
    }
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    __return_storage_ptr__ = local_258;
    pAVar3 = (local_258->curv_vert2vert).write_.shared_alloc_.alloc;
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    (__return_storage_ptr__->curv_vert2vert).write_.shared_alloc_.alloc = pAVar9;
    if (bVar13 && bVar12) {
      if (entering_parallel == '\x01') {
        (__return_storage_ptr__->curv_vert2vert).write_.shared_alloc_.alloc =
             (Alloc *)(pAVar9->size * 8 + 1);
      }
      else {
        pAVar9->use_count = pAVar9->use_count + 1;
      }
    }
    (__return_storage_ptr__->curv_vert2vert).write_.shared_alloc_.direct_ptr = pvVar4;
    pAVar3 = (__return_storage_ptr__->curv_vert_tangents).write_.shared_alloc_.alloc;
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    (__return_storage_ptr__->curv_vert_tangents).write_.shared_alloc_.alloc = local_2c8;
    if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        (__return_storage_ptr__->curv_vert_tangents).write_.shared_alloc_.alloc =
             (Alloc *)(local_2c8->size * 8 + 1);
      }
      else {
        local_2c8->use_count = local_2c8->use_count + 1;
      }
    }
    (__return_storage_ptr__->curv_vert_tangents).write_.shared_alloc_.direct_ptr = local_2c0;
    pAVar3 = (__return_storage_ptr__->curv_vert_curvatures).write_.shared_alloc_.alloc;
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    (__return_storage_ptr__->curv_vert_curvatures).write_.shared_alloc_.alloc = local_240;
    if (((ulong)local_240 & 7) == 0 && local_240 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        (__return_storage_ptr__->curv_vert_curvatures).write_.shared_alloc_.alloc =
             (Alloc *)(local_240->size * 8 + 1);
        iVar8 = local_240->use_count + -1;
      }
      else {
        iVar8 = local_240->use_count;
        local_240->use_count = iVar8 + 1;
      }
      (__return_storage_ptr__->curv_vert_curvatures).write_.shared_alloc_.direct_ptr = local_238;
      local_240->use_count = iVar8;
      if (iVar8 == 0) {
        Alloc::~Alloc(local_240);
        operator_delete(local_240,0x48);
      }
    }
    else {
      (__return_storage_ptr__->curv_vert_curvatures).write_.shared_alloc_.direct_ptr = local_238;
    }
    if (((ulong)local_250 & 7) == 0 && local_250 != (Alloc *)0x0) {
      piVar1 = &local_250->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_250);
        operator_delete(local_250,0x48);
      }
    }
    if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
      piVar1 = &local_2c8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2c8);
        operator_delete(local_2c8,0x48);
      }
    }
    if (((ulong)local_2b8 & 7) == 0 && local_2b8 != (Alloc *)0x0) {
      piVar1 = &local_2b8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2b8);
        operator_delete(local_2b8,0x48);
      }
    }
    if (bVar13 && bVar12) {
      piVar1 = &pAVar9->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar9);
        operator_delete(pAVar9,0x48);
      }
    }
    pAVar9 = local_230;
    if (bVar11 && bVar10) {
      piVar1 = &local_230->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_230);
        operator_delete(pAVar9,0x48);
      }
    }
    if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
      piVar1 = &local_278->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_278);
        operator_delete(local_278,0x48);
      }
    }
    if (((ulong)local_268 & 7) == 0 && local_268 != (Alloc *)0x0) {
      piVar1 = &local_268->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_268);
        operator_delete(local_268,0x48);
      }
    }
    if (((ulong)local_e0 & 7) == 0 && local_e0 != (Alloc *)0x0) {
      piVar1 = &local_e0->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_e0);
        operator_delete(local_e0,0x48);
      }
    }
    if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
      piVar1 = &local_d0->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_d0);
        operator_delete(local_d0,0x48);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

SurfaceInfo get_surface_info(Mesh* mesh) {
  SurfaceInfo out;
  if (mesh->dim() == 1) return out;
  auto sdim = mesh->dim() - 1;
  auto sides_are_surf = mark_by_class_dim(mesh, sdim, sdim);
  auto verts_are_surf = mark_by_class_dim(mesh, VERT, sdim);
  auto surf_side2side = collect_marked(sides_are_surf);
  auto surf_vert2vert = collect_marked(verts_are_surf);
  LOs curv_edge2edge;
  LOs curv_vert2vert;
  if (mesh->dim() == 3) {
    auto surf_side_normals = get_side_vectors(mesh, surf_side2side);
    auto surf_vert_normals = get_side_vert_normals(
        mesh, surf_side2side, surf_side_normals, surf_vert2vert);
    auto edges_are_curv = mark_by_class_dim(mesh, EDGE, EDGE);
    auto verts_are_curv = mark_by_class_dim(mesh, VERT, EDGE);
    curv_edge2edge = collect_marked(edges_are_curv);
    curv_vert2vert = collect_marked(verts_are_curv);
    auto surf_tri_IIs = get_surf_tri_IIs(mesh, surf_side2side,
        surf_side_normals, surf_vert2vert, surf_vert_normals);
    auto surf_vert_IIs = get_surf_vert_IIs(mesh, surf_side2side,
        surf_side_normals, surf_tri_IIs, surf_vert2vert, surf_vert_normals);
    out.surf_vert2vert = surf_vert2vert;
    out.surf_vert_normals = surf_vert_normals;
    out.surf_vert_IIs = surf_vert_IIs;
  } else {
    curv_edge2edge = surf_side2side;
    curv_vert2vert = surf_vert2vert;
  }
  auto curv_edge_tangents = get_curv_edge_tangents(mesh, curv_edge2edge);
  auto curv_vert_tangents = get_curv_vert_tangents(
      mesh, curv_edge2edge, curv_edge_tangents, curv_vert2vert);
  auto curv_edge_curvatures = get_curv_edge_curvatures(mesh, curv_edge2edge,
      curv_edge_tangents, curv_vert2vert, curv_vert_tangents);
  auto curv_vert_curvatures = get_curv_vert_curvatures(
      mesh, curv_edge2edge, curv_edge_curvatures, curv_vert2vert);
  out.curv_vert2vert = curv_vert2vert;
  out.curv_vert_tangents = curv_vert_tangents;
  out.curv_vert_curvatures = curv_vert_curvatures;
  return out;
}